

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

uint64_t fmt::v8::detail::multiply(uint64_t lhs,uint64_t rhs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 local_38;
  uint64_t f;
  __uint128_t product;
  uint64_t rhs_local;
  uint64_t lhs_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = lhs;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = rhs;
  product._0_8_ = SUB168(auVar1 * auVar2,8);
  if ((auVar1 * auVar2 & (undefined1  [16])0x8000000000000000) == (undefined1  [16])0x0) {
    local_38 = (uint64_t)product;
  }
  else {
    local_38 = (uint64_t)product + 1;
  }
  return local_38;
}

Assistant:

FMT_CONSTEXPR inline uint64_t multiply(uint64_t lhs, uint64_t rhs) {
#if FMT_USE_INT128
  auto product = static_cast<__uint128_t>(lhs) * rhs;
  auto f = static_cast<uint64_t>(product >> 64);
  return (static_cast<uint64_t>(product) & (1ULL << 63)) != 0 ? f + 1 : f;
#else
  // Multiply 32-bit parts of significands.
  uint64_t mask = (1ULL << 32) - 1;
  uint64_t a = lhs >> 32, b = lhs & mask;
  uint64_t c = rhs >> 32, d = rhs & mask;
  uint64_t ac = a * c, bc = b * c, ad = a * d, bd = b * d;
  // Compute mid 64-bit of result and round.
  uint64_t mid = (bd >> 32) + (ad & mask) + (bc & mask) + (1U << 31);
  return ac + (ad >> 32) + (bc >> 32) + (mid >> 32);
#endif
}